

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O2

void __thiscall
QPixmapColorizeFilter::draw
          (QPixmapColorizeFilter *this,QPainter *painter,QPointF *dest,QPixmap *src,QRectF *srcRect)

{
  long lVar1;
  double dVar2;
  char cVar3;
  byte bVar4;
  Format FVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint *puVar13;
  int x;
  ulong uVar14;
  int y;
  ulong uVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int local_c8;
  QPainter destPainter;
  QPainter bufPainter;
  int iStack_a4;
  int local_a0;
  int iStack_9c;
  QPainter maskPainter;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPixmap::isNull();
  if (cVar3 == '\0') {
    if ((*(byte *)(lVar1 + 0x98) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QPainter::drawPixmap(painter,dest,src,srcRect);
        return;
      }
      goto LAB_00378b25;
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_58);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_78);
    if ((((srcRect->w != 0.0) || (NAN(srcRect->w))) || (srcRect->h != 0.0)) || (NAN(srcRect->h))) {
      _maskPainter = (undefined1 *)QRectF::toAlignedRect();
      _destPainter = (QSize)QPixmap::rect();
      auVar16 = QRect::operator&((QRect *)&maskPainter,(QRect *)&destPainter);
      _bufPainter = auVar16._0_8_;
      QPixmap::copy((QRect *)&destPainter);
      QPixmap::toImage();
      QImage::operator=((QImage *)&local_58,(QImage *)&maskPainter);
      QImage::~QImage((QImage *)&maskPainter);
      QPixmap::~QPixmap((QPixmap *)&destPainter);
      bVar4 = QImage::hasAlphaChannel();
      QImage::convertToFormat
                ((QImage *)&maskPainter,(Format)(QImage *)&local_58,
                 (ImageConversionFlags)((uint)bVar4 * 2 + 4));
      QImage::operator=((QImage *)&local_58,(QImage *)&maskPainter);
      QImage::~QImage((QImage *)&maskPainter);
      local_a0 = auVar16._8_4_;
      iStack_9c = auVar16._12_4_;
      _destPainter = (local_a0 - _bufPainter) + 1;
      register0x00000004 = (iStack_9c - iStack_a4) + 1;
      FVar5 = QImage::format();
    }
    else {
      QPixmap::toImage();
      QImage::operator=((QImage *)&local_58,(QImage *)&maskPainter);
      QImage::~QImage((QImage *)&maskPainter);
      bVar4 = QImage::hasAlphaChannel();
      QImage::convertToFormat
                ((QImage *)&maskPainter,(Format)(QImage *)&local_58,
                 (ImageConversionFlags)((uint)bVar4 * 2 + 4));
      QImage::operator=((QImage *)&local_58,(QImage *)&maskPainter);
      QImage::~QImage((QImage *)&maskPainter);
      _destPainter = (QSize)QImage::size();
      FVar5 = QImage::format();
    }
    QImage::QImage((QImage *)&maskPainter,(QSize *)&destPainter,FVar5);
    QImage::operator=((QImage *)&local_78,(QImage *)&maskPainter);
    QImage::~QImage((QImage *)&maskPainter);
    dVar2 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar2);
    _destPainter = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&destPainter,(QPaintDevice *)&local_78);
    auVar16 = QImage::rect();
    if (auVar16._12_4_ == auVar16._4_4_ + -1 && auVar16._8_4_ == auVar16._0_4_ + -1) {
      auVar16 = QImage::rect();
      QImage::rect();
    }
    uVar15 = auVar16._0_8_ >> 0x20;
    lVar9 = QImage::bits();
    lVar10 = QImage::bits();
    lVar11 = QImage::size();
    lVar12 = QImage::size();
    if (lVar11 == lVar12) {
      auVar17 = QImage::rect();
      if (((auVar16._0_4_ != auVar17._0_4_) || (auVar17._8_4_ != auVar16._8_4_)) ||
         ((auVar16._4_4_ != auVar17._4_4_ || ((auVar17._8_8_ ^ auVar16._8_8_) >> 0x20 != 0))))
      goto LAB_003788a3;
      iVar6 = QImage::width();
      iVar7 = QImage::height();
      uVar14 = 0;
      uVar15 = (ulong)(uint)(iVar7 * iVar6);
      if (iVar7 * iVar6 < 1) {
        uVar15 = uVar14;
      }
      for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        uVar8 = qGray(*(QRgb *)(lVar9 + uVar14 * 4));
        *(uint *)(lVar10 + uVar14 * 4) =
             (uVar8 & 0xff) << 0x10 | uVar8 & 0xff | (uint)*(byte *)(lVar9 + 3 + uVar14 * 4) << 0x18
             | (uVar8 & 0xff) << 8;
      }
    }
    else {
LAB_003788a3:
      while (local_c8 = auVar16._12_4_, iVar6 = (int)uVar15, iVar6 <= local_c8) {
        iVar7 = QImage::height();
        if (iVar7 <= iVar6) break;
        lVar10 = QImage::scanLine((int)&local_58);
        puVar13 = (uint *)QImage::scanLine((int)&local_78);
        for (lVar9 = (long)auVar16._0_4_; lVar9 <= auVar16._8_4_; lVar9 = lVar9 + 1) {
          iVar7 = QImage::width();
          if (iVar7 <= lVar9) break;
          uVar8 = qGray(*(QRgb *)(lVar10 + lVar9 * 4));
          *puVar13 = (uVar8 & 0xff) << 0x10 | uVar8 & 0xff |
                     (uint)*(byte *)(lVar10 + 3 + lVar9 * 4) << 0x18 | (uVar8 & 0xff) << 8;
          puVar13 = puVar13 + 1;
        }
        uVar15 = (ulong)(iVar6 + 1);
      }
    }
    QPainter::setCompositionMode((CompositionMode)(QRect *)&destPainter);
    _maskPainter = (undefined1 *)QImage::rect();
    QPainter::fillRect((QRect *)&destPainter,(QColor *)&maskPainter);
    QPainter::end();
    if ((*(byte *)(lVar1 + 0x98) & 2) != 0) {
      _maskPainter = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)&maskPainter,(QImage *)&local_58);
      _bufPainter = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&bufPainter,(QPaintDevice *)&maskPainter);
      QPainter::setOpacity(*(double *)(lVar1 + 0x90));
      QPainter::drawImage(&bufPainter,0,0,(QImage *)&local_78,0,0,-1,-1,(ImageConversionFlags)0x0);
      QPainter::end();
      QImage::operator=((QImage *)&local_78,(QImage *)&maskPainter);
      QPainter::~QPainter(&bufPainter);
      QImage::~QImage((QImage *)&maskPainter);
    }
    cVar3 = QImage::hasAlphaChannel();
    if (cVar3 != '\0') {
      _maskPainter = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&maskPainter,(QPaintDevice *)&local_78);
      QPainter::setCompositionMode((CompositionMode)&maskPainter);
      QPainter::drawImage(&maskPainter,0,0,(QImage *)&local_58,0,0,-1,-1,(ImageConversionFlags)0x0);
      QPainter::~QPainter(&maskPainter);
    }
    QPainter::drawImage((QPointF *)painter,(QImage *)dest);
    QPainter::~QPainter(&destPainter);
    QImage::~QImage((QImage *)&local_78);
    QImage::~QImage((QImage *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00378b25:
  __stack_chk_fail();
}

Assistant:

void QPixmapColorizeFilter::draw(QPainter *painter, const QPointF &dest, const QPixmap &src, const QRectF &srcRect) const
{
    Q_D(const QPixmapColorizeFilter);

    if (src.isNull())
        return;

    // raster implementation

    if (!d->opaque) {
        painter->drawPixmap(dest, src, srcRect);
        return;
    }

    QImage srcImage;
    QImage destImage;

    if (srcRect.isNull()) {
        srcImage = src.toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(srcImage.size(), srcImage.format());
    } else {
        QRect rect = srcRect.toAlignedRect().intersected(src.rect());

        srcImage = src.copy(rect).toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(rect.size(), srcImage.format());
    }
    destImage.setDevicePixelRatio(src.devicePixelRatio());

    // do colorizing
    QPainter destPainter(&destImage);
    grayscale(srcImage, destImage, srcImage.rect());
    destPainter.setCompositionMode(QPainter::CompositionMode_Screen);
    destPainter.fillRect(srcImage.rect(), d->color);
    destPainter.end();

    if (d->alphaBlend) {
        // alpha blending srcImage and destImage
        QImage buffer = srcImage;
        QPainter bufPainter(&buffer);
        bufPainter.setOpacity(d->strength);
        bufPainter.drawImage(0, 0, destImage);
        bufPainter.end();
        destImage = std::move(buffer);
    }

    if (srcImage.hasAlphaChannel()) {
        Q_ASSERT(destImage.format() == QImage::Format_ARGB32_Premultiplied);
        QPainter maskPainter(&destImage);
        maskPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        maskPainter.drawImage(0, 0, srcImage);
    }

    painter->drawImage(dest, destImage);
}